

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

ssize_t zip_index_next(mz_uint64 *param_1,ssize_t cur_index)

{
  long local_30;
  ssize_t i;
  ssize_t new_index;
  ssize_t cur_index_local;
  mz_uint64 *local_header_ofs_array_local;
  
  local_30 = cur_index + -1;
  while( true ) {
    if (local_30 < 0) {
      return 0;
    }
    if (param_1[local_30] < param_1[cur_index]) break;
    local_30 = local_30 + -1;
  }
  return local_30 + 1;
}

Assistant:

static ssize_t zip_index_next(mz_uint64 *local_header_ofs_array,
                              ssize_t cur_index) {
  ssize_t new_index = 0, i;
  for (i = cur_index - 1; i >= 0; --i) {
    if (local_header_ofs_array[cur_index] > local_header_ofs_array[i]) {
      new_index = i + 1;
      return new_index;
    }
  }
  return new_index;
}